

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O3

double opengv::relative_pose::modules::eigensolver::getSmallestEV
                 (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,
                 Matrix3d *zxF,cayley_t *cayley,Matrix3d *M)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar5;
  undefined1 auVar9 [16];
  double dVar6;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Matrix3d local_58;
  undefined1 extraout_var [56];
  
  composeM(&local_58,xxF,yyF,zzF,xyF,yzF,zxF,cayley);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  dVar5 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [0];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar5;
  dVar6 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [4];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar6;
  dVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [8];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar1;
  dVar2 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [7];
  dVar3 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  dVar1 = (-dVar5 - dVar6) - dVar1;
  dVar4 = (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar4;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (dVar4 * -dVar4 - dVar2 * dVar2) - dVar3 * dVar3;
  auVar16 = vfmadd231sd_fma(auVar16,auVar25,auVar21);
  auVar16 = vfmadd231sd_fma(auVar16,auVar25,auVar22);
  auVar8 = vfmadd231sd_fma(auVar16,auVar21,auVar22);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar4 * dVar4;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar5 * dVar2 * dVar2;
  auVar16 = vfmadd231sd_fma(auVar23,auVar21,auVar17);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar3 * dVar3;
  auVar16 = vfmadd231sd_fma(auVar16,auVar22,auVar24);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar5 * dVar6;
  auVar16 = vfnmadd213sd_fma(auVar18,auVar22,auVar16);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar2 * dVar3 * -2.0;
  auVar16 = vfmadd213sd_fma(auVar13,auVar19,auVar16);
  auVar12._0_8_ = pow(dVar1,3.0);
  auVar12._8_56_ = extraout_var;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar8._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1 * -9.0 * auVar8._0_8_;
  auVar8 = vfmadd231sd_fma(auVar14,auVar12._0_16_,ZEXT816(0x4000000000000000));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = auVar16._0_8_;
  auVar16 = vfmadd231sd_fma(auVar8,auVar7,ZEXT816(0x403b000000000000));
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1 * dVar1;
  auVar8 = vfmadd231sd_fma(auVar8,auVar20,ZEXT816(0xc008000000000000));
  dVar5 = pow(auVar8._0_8_,3.0);
  dVar5 = dVar5 * 4.0;
  if (dVar5 < 0.0) {
    dVar6 = sqrt(dVar5);
  }
  else {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar5;
    auVar8 = vsqrtsd_avx(auVar9,auVar9);
    dVar6 = auVar8._0_8_;
  }
  dVar6 = acos(auVar16._0_8_ / dVar6);
  dVar6 = cos(dVar6 / 3.0);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar5;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    auVar16 = vsqrtsd_avx(auVar10,auVar10);
    dVar5 = auVar16._0_8_;
  }
  dVar5 = pow(dVar5 * 0.5,0.3333333333333333);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar5 * dVar6;
  auVar16 = vfmsub231sd_fma(auVar15,auVar11,ZEXT816(0xc000000000000000));
  return auVar16._0_8_ / 3.0;
}

Assistant:

double
opengv::relative_pose::modules::eigensolver::getSmallestEV(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const cayley_t & cayley,
    Eigen::Matrix3d & M )
{
  M = composeM(xxF,yyF,zzF,xyF,yzF,zxF,cayley);

  //Retrieve the smallest Eigenvalue by the following closed form solution
  double b = -M(0,0)-M(1,1)-M(2,2);
  double c =
      -pow(M(0,2),2)-pow(M(1,2),2)-pow(M(0,1),2)+
      M(0,0)*M(1,1)+M(0,0)*M(2,2)+M(1,1)*M(2,2);
  double d =
      M(1,1)*pow(M(0,2),2)+M(0,0)*pow(M(1,2),2)+M(2,2)*pow(M(0,1),2)-
      M(0,0)*M(1,1)*M(2,2)-2*M(0,1)*M(1,2)*M(0,2);

  double s = 2*pow(b,3)-9*b*c+27*d;
  double t = 4*pow((pow(b,2)-3*c),3);

  double alpha = acos(s/sqrt(t));
  double beta = alpha/3;
  double y = cos(beta);

  double r = 0.5*sqrt(t);
  double w = pow(r,(1.0/3.0));

  double k = w*y;
  double smallestEV = (-b-2*k)/3;
  return smallestEV;
}